

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

int __thiscall
f8n::runtime::MessageQueue::Remove(MessageQueue *this,IMessageTarget *target,int type)

{
  _List_node_base *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  iterator __position;
  int iVar3;
  IMessagePtr current;
  LockT lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->queueMutex);
  __position._M_node =
       (this->queue).
       super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar3 = 0;
  do {
    if (__position._M_node == (_List_node_base *)&this->queue) {
      if ((this->queue).
          super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
          ._M_impl._M_node._M_size != 0) {
        LOCK();
        (this->nextMessageTime).super___atomic_base<long>._M_i =
             (__int_type)
             (this->queue).
             super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
             ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
        UNLOCK();
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      return iVar3;
    }
    std::__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&current.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> *)
               __position._M_node[1]._M_next);
    iVar2 = (*(current.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_IMessage[2])();
    if ((IMessageTarget *)CONCAT44(extraout_var,iVar2) == target) {
      if (type != -1) {
        iVar2 = (*(current.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_IMessage[3])();
        if (iVar2 != type) goto LAB_001cfe76;
      }
      p_Var1 = __position._M_node[1]._M_next;
      if (p_Var1 != (_List_node_base *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_prev);
      }
      operator_delete(p_Var1,0x18);
      __position = std::__cxx11::
                   list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                   ::erase(&this->queue,__position._M_node);
      iVar3 = iVar3 + 1;
    }
    else {
LAB_001cfe76:
      __position._M_node = (__position._M_node)->_M_next;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&current.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

int MessageQueue::Remove(IMessageTarget *target, int type) {
    LockT lock(this->queueMutex);

    int count = 0;
    std::list<EnqueuedMessage*>::iterator it = this->queue.begin();
    while (it != this->queue.end()) {
        IMessagePtr current = (*it)->message;

        if (current->Target() == target) {
            if (type == -1 || type == current->Type()) {
                delete (*it);
                it = this->queue.erase(it);
                ++count;
                continue;
            }
        }

        ++it;
    }

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    return count;
}